

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O1

int mbedtls_cipher_check_tag(mbedtls_cipher_context_t *ctx,uchar *tag,size_t tag_len)

{
  int iVar1;
  size_t sVar2;
  byte bVar3;
  uchar check_tag [16];
  byte local_28 [24];
  
  iVar1 = -0x6100;
  if ((((ctx != (mbedtls_cipher_context_t *)0x0) &&
       (ctx->cipher_info != (mbedtls_cipher_info_t *)0x0)) && (ctx->operation == MBEDTLS_DECRYPT))
     && (iVar1 = 0, ctx->cipher_info->mode == MBEDTLS_MODE_GCM)) {
    iVar1 = -0x6100;
    if ((tag_len < 0x11) &&
       (iVar1 = mbedtls_gcm_finish((mbedtls_gcm_context *)ctx->cipher_ctx,local_28,tag_len),
       iVar1 == 0)) {
      if (tag_len == 0) {
        iVar1 = 0;
      }
      else {
        bVar3 = 0;
        sVar2 = 0;
        do {
          bVar3 = bVar3 | local_28[sVar2] ^ tag[sVar2];
          sVar2 = sVar2 + 1;
        } while (tag_len != sVar2);
        iVar1 = -0x6300;
        if (bVar3 == 0) {
          iVar1 = 0;
        }
      }
    }
    return iVar1;
  }
  return iVar1;
}

Assistant:

int mbedtls_cipher_check_tag( mbedtls_cipher_context_t *ctx,
                      const unsigned char *tag, size_t tag_len )
{
    int ret;

    if( NULL == ctx || NULL == ctx->cipher_info ||
        MBEDTLS_DECRYPT != ctx->operation )
    {
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );
    }

    if( MBEDTLS_MODE_GCM == ctx->cipher_info->mode )
    {
        unsigned char check_tag[16];
        size_t i;
        int diff;

        if( tag_len > sizeof( check_tag ) )
            return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );

        if( 0 != ( ret = mbedtls_gcm_finish( (mbedtls_gcm_context *) ctx->cipher_ctx,
                                     check_tag, tag_len ) ) )
        {
            return( ret );
        }

        /* Check the tag in "constant-time" */
        for( diff = 0, i = 0; i < tag_len; i++ )
            diff |= tag[i] ^ check_tag[i];

        if( diff != 0 )
            return( MBEDTLS_ERR_CIPHER_AUTH_FAILED );

        return( 0 );
    }

    return( 0 );
}